

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

string * __thiscall
license::EventRegistry::to_string_abi_cxx11_(string *__return_storage_ptr__,EventRegistry *this)

{
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  EventRegistry *local_18;
  EventRegistry *this_local;
  
  local_18 = this;
  this_local = (EventRegistry *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,this);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string EventRegistry::to_string() const {
	std::stringstream ss;
	ss << this;
	return ss.str();
}